

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_err.cpp
# Opt level: O0

void WarningImpl(char *id,char *message,char *badValueMessage,EWStatus type)

{
  size_t sVar1;
  char *local_38;
  int warningTxtPos;
  EWStatus type_local;
  char *badValueMessage_local;
  char *message_local;
  char *id_local;
  
  if ((DAT_001e16a5 & 1) == 0) {
switchD_0011f473_default:
    WarningCount = WarningCount + 1;
    CDefineTable::Replace(&DefineTable,"__WARNINGS__",WarningCount);
    initErrorLine();
    sVar1 = strlen(ErrorLine);
    if (id == (char *)0x0) {
      strncat(ErrorLine,"warning: ",0xfff);
    }
    else {
      strncat(ErrorLine,"warning[",0xfff);
      strncat(ErrorLine,id,0xfff);
      strncat(ErrorLine,"]: ",0xfff);
    }
    if (extraErrorWarningPrefix != (char *)0x0) {
      strncat(ErrorLine,extraErrorWarningPrefix,0xfff);
    }
    local_38 = message;
    if (message == (char *)0x0) {
      local_38 = nullptr_message_txt;
    }
    strncat(ErrorLine,local_38,0xfff);
    if (badValueMessage != (char *)0x0) {
      strncat(ErrorLine,": ",0xfff);
      strncat(ErrorLine,badValueMessage,0xfff);
    }
    outputErrorLine(OV_WARNING,(int)sVar1,7);
  }
  else {
    switch(type) {
    case W_ALL:
      Error(message,badValueMessage,ALL);
      break;
    case W_EARLY:
      Error(message,badValueMessage,EARLY);
      break;
    case W_PASS3:
      Error(message,badValueMessage,PASS3);
      break;
    case W_PASS03:
      Error(message,badValueMessage,PASS03);
      break;
    default:
      goto switchD_0011f473_default;
    }
  }
  return;
}

Assistant:

static void WarningImpl(const char* id, const char* message, const char* badValueMessage, EWStatus type) {
	// turn the warning into error if "Warnings as errors" is switched on
	if (Options::syx.WarningsAsErrors) switch (type) {
		case W_EARLY:	Error(message, badValueMessage, EARLY); return;
		case W_PASS3:	Error(message, badValueMessage, PASS3); return;
		case W_PASS03:	Error(message, badValueMessage, PASS03); return;
		case W_ALL:		Error(message, badValueMessage, ALL); return;
	}

	++WarningCount;
	DefineTable.Replace("__WARNINGS__", WarningCount);

	initErrorLine();
	const int warningTxtPos = strlen(ErrorLine);
	if (id) {
		STRCAT(ErrorLine, LINEMAX2-1, "warning[");
		STRCAT(ErrorLine, LINEMAX2-1, id);
		STRCAT(ErrorLine, LINEMAX2-1, "]: ");
	} else {
		STRCAT(ErrorLine, LINEMAX2-1, "warning: ");
	}
	if (extraErrorWarningPrefix) STRCAT(ErrorLine, LINEMAX2-1, extraErrorWarningPrefix);
	STRCAT(ErrorLine, LINEMAX2-1, message ? message : nullptr_message_txt);
	if (badValueMessage) {
		STRCAT(ErrorLine, LINEMAX2-1, ": "); STRCAT(ErrorLine, LINEMAX2-1, badValueMessage);
	}
	outputErrorLine(OV_WARNING, warningTxtPos, 7);
}